

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::AddArgMinMaxNFunction<duckdb::LessThan>(AggregateFunctionSet *set)

{
  initializer_list<duckdb::LogicalType> iVar1;
  AggregateFunction function;
  allocator_type *in_stack_fffffffffffffc38;
  AggregateFunction *function_00;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffc40;
  AggregateFunction *this;
  iterator in_stack_fffffffffffffc48;
  AggregateFunction *pAVar2;
  size_type in_stack_fffffffffffffc50;
  code *this_00;
  LogicalType *local_338;
  aggregate_update_t in_stack_fffffffffffffce8;
  aggregate_initialize_t in_stack_fffffffffffffcf0;
  aggregate_size_t in_stack_fffffffffffffcf8;
  LogicalType *in_stack_fffffffffffffd00;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffd08;
  AggregateFunction *in_stack_fffffffffffffd10;
  aggregate_combine_t in_stack_fffffffffffffd50;
  aggregate_finalize_t in_stack_fffffffffffffd58;
  aggregate_simple_update_t in_stack_fffffffffffffd60;
  bind_aggregate_function_t in_stack_fffffffffffffd68;
  aggregate_destructor_t in_stack_fffffffffffffd70;
  aggregate_statistics_t in_stack_fffffffffffffd78;
  aggregate_window_t in_stack_fffffffffffffd80;
  aggregate_serialize_t in_stack_fffffffffffffd88;
  aggregate_deserialize_t in_stack_fffffffffffffd90;
  LogicalType local_1f0 [24];
  LogicalType local_1d8 [40];
  LogicalType *local_1b0;
  LogicalType local_1a8 [24];
  LogicalType local_190 [24];
  LogicalType local_178 [24];
  LogicalType *local_160;
  undefined8 local_158;
  
  local_1b0 = local_1a8;
  duckdb::LogicalType::LogicalType(local_1b0,ANY);
  local_1b0 = local_190;
  duckdb::LogicalType::LogicalType(local_1b0,ANY);
  local_1b0 = local_178;
  duckdb::LogicalType::LogicalType(local_1b0,BIGINT);
  local_160 = local_1a8;
  local_158 = 3;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x829ed4);
  iVar1._M_len = in_stack_fffffffffffffc50;
  iVar1._M_array = in_stack_fffffffffffffc48;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffc40,iVar1,in_stack_fffffffffffffc38);
  duckdb::LogicalType::LogicalType(local_1f0,ANY);
  duckdb::LogicalType::LIST(local_1d8);
  this_00 = ArgMinMaxNBind<duckdb::LessThan>;
  pAVar2 = (AggregateFunction *)0x0;
  this = (AggregateFunction *)0x0;
  function_00 = (AggregateFunction *)0x0;
  AggregateFunction::AggregateFunction
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
             in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
             in_stack_fffffffffffffd50,in_stack_fffffffffffffd58,in_stack_fffffffffffffd60,
             in_stack_fffffffffffffd68,in_stack_fffffffffffffd70,in_stack_fffffffffffffd78,
             in_stack_fffffffffffffd80,in_stack_fffffffffffffd88,in_stack_fffffffffffffd90);
  duckdb::LogicalType::~LogicalType(local_1d8);
  duckdb::LogicalType::~LogicalType(local_1f0);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x829fcc);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x829fd9);
  local_338 = (LogicalType *)&local_160;
  do {
    local_338 = local_338 + -0x18;
    duckdb::LogicalType::~LogicalType(local_338);
  } while (local_338 != local_1a8);
  AggregateFunction::AggregateFunction((AggregateFunction *)this_00,pAVar2);
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)this,function_00);
  AggregateFunction::~AggregateFunction(this);
  AggregateFunction::~AggregateFunction(this);
  return;
}

Assistant:

static void AddArgMinMaxNFunction(AggregateFunctionSet &set) {
	AggregateFunction function({LogicalTypeId::ANY, LogicalTypeId::ANY, LogicalType::BIGINT},
	                           LogicalType::LIST(LogicalType::ANY), nullptr, nullptr, nullptr, nullptr, nullptr,
	                           nullptr, ArgMinMaxNBind<COMPARATOR>);

	return set.AddFunction(function);
}